

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<true>::nameSpaceInfoValue(TC_parser<true> *this)

{
  bool bVar1;
  long in_RDI;
  float fVar2;
  char *end_read;
  char *in_stack_00000018;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  char *in_stack_000000d8;
  TC_parser<true> *in_stack_000000e0;
  
  if ((((**(char **)(in_RDI + 8) != ' ') && (**(char **)(in_RDI + 8) != '\t')) &&
      (*(long *)(in_RDI + 8) != *(long *)(in_RDI + 0x10))) &&
     ((**(char **)(in_RDI + 8) != '|' && (**(char **)(in_RDI + 8) != '\r')))) {
    if (**(char **)(in_RDI + 8) == ':') {
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
      fVar2 = parseFloat(in_stack_00000018,&this->beginLine,end_read);
      *(float *)(in_RDI + 0x18) = fVar2;
      if (*(long *)(in_RDI + 8) == 0) {
        parserWarning(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                      in_stack_000000c0);
      }
      bVar1 = nanpattern(0.0);
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0x18) = 0x3f800000;
        parserWarning(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                      in_stack_000000c0);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      parserWarning(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                    in_stack_000000c0);
    }
  }
  return;
}

Assistant:

inline void nameSpaceInfoValue()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || reading_head == endLine || *reading_head == '|' ||
        *reading_head == '\r')
    {
      // nameSpaceInfoValue -->  ø
    }
    else if (*reading_head == ':')
    {
      // nameSpaceInfoValue --> ':' 'Float'
      ++reading_head;
      char* end_read = nullptr;
      cur_channel_v = parseFloat(reading_head, &end_read);
      if (end_read == reading_head)
      {
        parserWarning("malformed example! Float expected after : \"", beginLine, reading_head, "\"");
      }
      if (nanpattern(cur_channel_v))
      {
        cur_channel_v = 1.f;
        parserWarning(
            "warning: invalid namespace value:\"", reading_head, end_read, "\" read as NaN. Replacing with 1.");
      }
      reading_head = end_read;
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|',':', space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
  }